

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxml2cpp.cpp
# Opt level: O3

QTextStream * __thiscall
QDBusXmlToCpp::writeHeader(QDBusXmlToCpp *this,QTextStream *ts,bool changesWillBeLost)

{
  QTextStream *pQVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  QFileInfo local_50 [8];
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QTextStream *)
           QTextStream::operator<<
                     (ts,
                      "/*\n * This file was generated by qdbusxml2cpp version 0.8\n * Source file was "
                     );
  QFileInfo::QFileInfo(local_50,&this->inputFile);
  QFileInfo::fileName();
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,&local_48);
  QTextStream::operator<<
            (pQVar1,
             "\n *\n * qdbusxml2cpp is Copyright (C) The Qt Company Ltd. and other contributors.\n *\n * This is an auto-generated file.\n"
            );
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  QFileInfo::~QFileInfo(local_50);
  pcVar2 = 
  " * This file may have been hand-edited. Look for HAND-EDIT comments\n * before re-generating it.\n"
  ;
  if (changesWillBeLost) {
    pcVar2 = " * Do not edit! All changes made to it will be lost.\n";
  }
  QTextStream::operator<<(ts,pcVar2);
  QTextStream::operator<<(ts," */\n\n");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return ts;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QDBusXmlToCpp::writeHeader(QTextStream &ts, bool changesWillBeLost)
{
    ts << "/*\n"
          " * This file was generated by " PROGRAMNAME " version " PROGRAMVERSION "\n"
          " * Source file was " << QFileInfo(inputFile).fileName() << "\n"
          " *\n"
          " * " PROGRAMNAME " is " PROGRAMCOPYRIGHT "\n"
          " *\n"
          " * This is an auto-generated file.\n";

    if (changesWillBeLost)
        ts << " * Do not edit! All changes made to it will be lost.\n";
    else
        ts << " * This file may have been hand-edited. Look for HAND-EDIT comments\n"
              " * before re-generating it.\n";

    ts << " */\n\n";

    return ts;
}